

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.h
# Opt level: O3

bool __thiscall aiFace::operator==(aiFace *this,aiFace *o)

{
  uint uVar1;
  uint *puVar2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  
  puVar2 = this->mIndices;
  bVar4 = true;
  if (puVar2 != o->mIndices) {
    if ((puVar2 == (uint *)0x0) || (uVar1 = this->mNumIndices, uVar1 != o->mNumIndices)) {
      return false;
    }
    if ((ulong)uVar1 != 0) {
      lVar3 = 0;
      do {
        bVar4 = puVar2[lVar3] == o->mIndices[lVar3];
        if (!bVar4) {
          return bVar4;
        }
        bVar5 = (ulong)uVar1 - 1 != lVar3;
        lVar3 = lVar3 + 1;
      } while (bVar5);
    }
  }
  return bVar4;
}

Assistant:

bool operator== (const aiFace& o) const {
        if (mIndices == o.mIndices) {
            return true;
        }

        if (nullptr != mIndices && mNumIndices != o.mNumIndices) {
            return false;
        }

        if (nullptr == mIndices) {
            return false;
        }

        for (unsigned int i = 0; i < this->mNumIndices; ++i) {
            if (mIndices[i] != o.mIndices[i]) {
                return false;
            }
        }

        return true;
    }